

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O2

void duckdb_brotli::BrotliSetDictionaryData(uint8_t *data)

{
  return;
}

Assistant:

void duckdb_brotli::BrotliSetDictionaryData(const uint8_t* data) {
#if defined(BROTLI_EXTERNAL_DICTIONARY_DATA)
  if (!!data && !kBrotliDictionary.data) {
    kBrotliDictionary.data = data;
  }
#else
  BROTLI_UNUSED(data);  // Appease -Werror=unused-parameter
#endif
}